

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O1

void __thiscall chrono::ChLinkUniversal::ConstraintsFetch_react(ChLinkUniversal *this,double factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ChBodyFrame *pCVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ChMatrix33<double> mat2;
  ChMatrix33<double> *local_68;
  ChMatrix33<double> *local_60;
  ChMatrix33<double> local_58;
  
  dVar32 = factor * (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.l_i;
  pCVar31 = (this->super_ChLink).Body2;
  local_68 = &(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  dVar35 = factor * (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar33 = factor * (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar34 = factor * (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(double *)
                  ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar33;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       dVar34 * *(double *)
                 ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar1 = vfmadd231sd_fma(auVar55,auVar49,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar35;
  auVar1 = vfmadd231sd_fma(auVar1,auVar42,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       dVar34 * *(double *)
                 ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar2 = vfmadd231sd_fma(auVar59,auVar49,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar2 = vfmadd231sd_fma(auVar2,auVar42,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 8);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       dVar34 * *(double *)
                 ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar33;
  auVar3 = vfmadd231sd_fma(auVar36,auVar50,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x38);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar35;
  auVar3 = vfmadd231sd_fma(auVar3,auVar43,auVar6);
  dVar35 = auVar3._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       dVar35 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
  auVar3 = vfmadd231sd_fma(auVar44,auVar2,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x40);
  auVar3 = vfmadd231sd_fma(auVar3,auVar1,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 8);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar35 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
  auVar4 = vfmadd231sd_fma(auVar51,auVar2,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar4 = vfmadd231sd_fma(auVar4,auVar1,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       dVar35 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
  auVar2 = vfmadd231sd_fma(auVar37,auVar2,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar1 = vfmadd231sd_fma(auVar2,auVar1,auVar12);
  (this->super_ChLink).react_force.m_data[0] = auVar1._0_8_;
  (this->super_ChLink).react_force.m_data[1] = auVar4._0_8_;
  (this->super_ChLink).react_force.m_data[2] = auVar3._0_8_;
  pCVar31 = (this->super_ChLink).Body1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar35 = *(double *)
            ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x18);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       *(double *)
        ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       dVar35 * *(double *)
                 ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x38);
  auVar1 = vfmadd231sd_fma(auVar56,auVar38,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar1 = vfmadd231sd_fma(auVar1,auVar52,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       dVar35 * *(double *)
                 ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 8);
  auVar2 = vfmadd231sd_fma(auVar57,auVar38,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar2 = vfmadd231sd_fma(auVar2,auVar52,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(double *)
        ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       dVar35 * *(double *)
                 ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar3 = vfmadd231sd_fma(auVar45,auVar38,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(double *)
        ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar3 = vfmadd231sd_fma(auVar3,auVar52,auVar18);
  local_60 = &this->m_v2_tilde;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_58,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_68);
  dVar35 = dVar32 * auVar1._0_8_;
  dVar33 = dVar32 * auVar2._0_8_;
  dVar32 = dVar32 * auVar3._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar33;
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       dVar32 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar1 = vfmadd231sd_fma(auVar58,auVar46,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar35;
  auVar1 = vfmadd231sd_fma(auVar1,auVar39,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       dVar32 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar2 = vfmadd231sd_fma(auVar60,auVar46,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar2 = vfmadd231sd_fma(auVar2,auVar39,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar33;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       dVar32 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar3 = vfmadd231sd_fma(auVar53,auVar47,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar35;
  auVar3 = vfmadd231sd_fma(auVar3,auVar40,auVar24);
  dVar35 = auVar3._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       dVar35 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
  auVar3 = vfnmsub231sd_fma(auVar41,auVar2,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar3 = vfnmadd231sd_fma(auVar3,auVar1,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       dVar35 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
  auVar4 = vfnmsub231sd_fma(auVar48,auVar2,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar4 = vfnmadd231sd_fma(auVar4,auVar1,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       dVar35 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
  auVar2 = vfnmsub231sd_fma(auVar54,auVar2,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar1 = vfnmadd231sd_fma(auVar2,auVar1,auVar30);
  (this->super_ChLink).react_torque.m_data[0] = auVar1._0_8_;
  (this->super_ChLink).react_torque.m_data[1] = auVar4._0_8_;
  (this->super_ChLink).react_torque.m_data[2] = auVar3._0_8_;
  return;
}

Assistant:

void ChLinkUniversal::ConstraintsFetch_react(double factor) {
    // Extract the Lagrange multipliers for the 3 spherical constraints and for
    // the dot constraint.
    ChVector<> lam_sph(m_cnstr_x.Get_l_i(), m_cnstr_y.Get_l_i(), m_cnstr_z.Get_l_i());
    double lam_dot = m_cnstr_dot.Get_l_i();

    // Note that the Lagrange multipliers must be multiplied by 'factor' to
    // convert from reaction impulses to reaction forces.
    lam_sph *= factor;
    lam_dot *= factor;

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the universal joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(v2') *A_2^T * u1 * lam_dot
    //     = -C^T * [A_2 * tilde(v2')]^T * u1 * lam_dot

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_v2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_dot * u1);
    react_torque = m_frame2.GetA().transpose() * (-T2);
}